

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O1

void bcwrite_ktabk(BCWriteCtx *ctx,cTValue *o,int narrow)

{
  double dVar1;
  char *pcVar2;
  bool bVar3;
  MSize n;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  double dVar10;
  
  if ((ctx->sb).sz < (ctx->sb).n + 0xb) {
    bcwrite_resize(ctx,0xb);
  }
  uVar6 = (o->field_2).it;
  if (uVar6 == 0xfffffffb) {
    uVar6 = (o->u32).lo;
    uVar8 = *(uint *)((ulong)uVar6 + 0xc);
    uVar9 = uVar8 + 5;
    if ((ctx->sb).sz < (ctx->sb).n + uVar9) {
      bcwrite_resize(ctx,uVar9);
    }
    uVar4 = (ctx->sb).n;
    pcVar2 = (ctx->sb).buf;
    uVar7 = uVar9;
    if (0x7f < uVar9) {
      do {
        uVar5 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
        pcVar2[uVar5] = (byte)uVar9 | 0x80;
        uVar7 = uVar9 >> 7;
        bVar3 = 0x3fff < uVar9;
        uVar9 = uVar7;
      } while (bVar3);
    }
    pcVar2[uVar4] = (char)uVar7;
    pcVar2 = (ctx->sb).buf;
    (ctx->sb).n = uVar4 + uVar8 + 1;
    if ((ulong)uVar8 != 0) {
      uVar5 = 0;
      do {
        pcVar2[uVar5 + (uVar4 + 1)] = *(char *)((ulong)uVar6 + 0x10 + uVar5);
        uVar5 = uVar5 + 1;
      } while (uVar8 != uVar5);
    }
  }
  else if (uVar6 < 0xfffeffff) {
    if (narrow != 0) {
      dVar1 = o->n;
      dVar10 = (double)(int)dVar1;
      if ((dVar1 == dVar10) && (!NAN(dVar1) && !NAN(dVar10))) {
        uVar8 = (uint)dVar1;
        uVar6 = (ctx->sb).n;
        (ctx->sb).n = uVar6 + 1;
        (ctx->sb).buf[uVar6] = '\x03';
        uVar6 = (ctx->sb).n;
        pcVar2 = (ctx->sb).buf;
        uVar9 = uVar8;
        if (0x7f < uVar8) {
          do {
            uVar5 = (ulong)uVar6;
            uVar6 = uVar6 + 1;
            pcVar2[uVar5] = (byte)uVar8 | 0x80;
            uVar9 = uVar8 >> 7;
            bVar3 = 0x3fff < uVar8;
            uVar8 = uVar9;
          } while (bVar3);
        }
        pcVar2[uVar6] = (char)uVar9;
        (ctx->sb).n = uVar6 + 1;
        if ((dVar1 == dVar10) && (!NAN(dVar1) && !NAN(dVar10))) {
          return;
        }
      }
    }
    uVar6 = (ctx->sb).n;
    (ctx->sb).n = uVar6 + 1;
    (ctx->sb).buf[uVar6] = '\x04';
    uVar6 = (o->u32).lo;
    uVar8 = (ctx->sb).n;
    pcVar2 = (ctx->sb).buf;
    uVar9 = uVar6;
    if (0x7f < uVar6) {
      do {
        uVar5 = (ulong)uVar8;
        uVar8 = uVar8 + 1;
        pcVar2[uVar5] = (byte)uVar6 | 0x80;
        uVar9 = uVar6 >> 7;
        bVar3 = 0x3fff < uVar6;
        uVar6 = uVar9;
      } while (bVar3);
    }
    uVar4 = uVar8 + 1;
    pcVar2[uVar8] = (char)uVar9;
    (ctx->sb).n = uVar4;
    uVar6 = (o->field_2).it;
    pcVar2 = (ctx->sb).buf;
    uVar8 = uVar6;
    if (0x7f < uVar6) {
      do {
        uVar5 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
        pcVar2[uVar5] = (byte)uVar6 | 0x80;
        uVar8 = uVar6 >> 7;
        bVar3 = 0x3fff < uVar6;
        uVar6 = uVar8;
      } while (bVar3);
    }
    pcVar2[uVar4] = (char)uVar8;
    (ctx->sb).n = uVar4 + 1;
  }
  else {
    uVar8 = (ctx->sb).n;
    (ctx->sb).n = uVar8 + 1;
    (ctx->sb).buf[uVar8] = ~(byte)uVar6;
  }
  return;
}

Assistant:

static void bcwrite_ktabk(BCWriteCtx *ctx, cTValue *o, int narrow)
{
  bcwrite_need(ctx, 1+10);
  if (tvisstr(o)) {
    const GCstr *str = strV(o);
    MSize len = str->len;
    bcwrite_need(ctx, 5+len);
    bcwrite_uleb128(ctx, BCDUMP_KTAB_STR+len);
    bcwrite_block(ctx, strdata(str), len);
  } else if (tvisint(o)) {
    bcwrite_byte(ctx, BCDUMP_KTAB_INT);
    bcwrite_uleb128(ctx, intV(o));
  } else if (tvisnum(o)) {
    if (!LJ_DUALNUM && narrow) {  /* Narrow number constants to integers. */
      lua_Number num = numV(o);
      int32_t k = lj_num2int(num);
      if (num == (lua_Number)k) {  /* -0 is never a constant. */
	bcwrite_byte(ctx, BCDUMP_KTAB_INT);
	bcwrite_uleb128(ctx, k);
	return;
      }
    }
    bcwrite_byte(ctx, BCDUMP_KTAB_NUM);
    bcwrite_uleb128(ctx, o->u32.lo);
    bcwrite_uleb128(ctx, o->u32.hi);
  } else {
    lua_assert(tvispri(o));
    bcwrite_byte(ctx, BCDUMP_KTAB_NIL+~itype(o));
  }
}